

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

data_elem * pfx_table_find_elem(node_data *data,pfx_record *record,uint *index)

{
  long lVar1;
  long in_FS_OFFSET;
  uint local_34;
  uint i;
  uint *index_local;
  pfx_record *record_local;
  node_data *data_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  do {
    if (data->len <= local_34) {
      data_local = (node_data *)0x0;
LAB_00108d65:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (data_elem *)data_local;
      }
      __stack_chk_fail();
    }
    if (((data->ary[local_34].asn == record->asn) &&
        (data->ary[local_34].max_len == record->max_len)) &&
       (data->ary[local_34].socket == record->socket)) {
      if (index != (uint *)0x0) {
        *index = local_34;
      }
      data_local = (node_data *)(data->ary + local_34);
      goto LAB_00108d65;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

struct data_elem *pfx_table_find_elem(const struct node_data *data, const struct pfx_record *record,
				      unsigned int *index)
{
	for (unsigned int i = 0; i < data->len; i++) {
		if (data->ary[i].asn == record->asn && data->ary[i].max_len == record->max_len &&
		    data->ary[i].socket == record->socket) {
			if (index)
				*index = i;
			return &(data->ary[i]);
		}
	}
	return NULL;
}